

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsort.scat.c
# Opt level: O0

void ga_sort_scat_dcpl_(Integer *pn,DoubleComplex *v,Integer *i,Integer *j,Integer *base)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  ulong *in_RDI;
  undefined8 *in_R8;
  Integer n;
  Integer *hi;
  Integer *q;
  Integer *p;
  unsigned_long g;
  unsigned_long gap;
  long ib_2;
  long ia_2;
  DoubleComplex dtmp_2;
  Integer ltmp_2;
  long ib_1;
  long ia_1;
  DoubleComplex dtmp_1;
  Integer ltmp_1;
  long ib;
  long ia;
  DoubleComplex dtmp;
  Integer ltmp;
  Integer *base0;
  
  if (1 < (long)*in_RDI) {
    ib = (long)*in_RDI >> 1;
    ia_1 = (long)(in_R8 + ib * 2 + -1);
    if ((*in_RDI & 1) != 0) {
      ia_1 = ia_1 + 8;
    }
    for (; ib != 1; ib = ib + -1) {
      ltmp_1 = ib;
      dtmp_1.imag = (DoublePrecision)(in_R8 + ib + -1);
      while (dtmp_1.real = (DoublePrecision)((long)dtmp_1.imag + ltmp_1 * 8),
            (ulong)dtmp_1.real <= (ulong)ia_1) {
        ltmp_1 = ltmp_1 * 2;
        if ((dtmp_1.real != (DoublePrecision)ia_1) &&
           (*(long *)dtmp_1.real < *(long *)((long)dtmp_1.real + 8))) {
          dtmp_1.real = (DoublePrecision)((long)dtmp_1.real + 8);
          ltmp_1 = ltmp_1 + 1;
        }
        if (*(long *)dtmp_1.real <= *(long *)dtmp_1.imag) break;
        lVar3 = (long)dtmp_1.imag - (long)in_R8 >> 3;
        lVar4 = (long)dtmp_1.real - (long)in_R8 >> 3;
        uVar1 = *(undefined8 *)dtmp_1.imag;
        *(undefined8 *)dtmp_1.imag = *(undefined8 *)dtmp_1.real;
        *(undefined8 *)dtmp_1.real = uVar1;
        uVar1 = in_RSI[lVar3 * 2];
        uVar2 = (in_RSI + lVar3 * 2)[1];
        in_RSI[lVar3 * 2] = in_RSI[lVar4 * 2];
        (in_RSI + lVar3 * 2)[1] = (in_RSI + lVar4 * 2)[1];
        in_RSI[lVar4 * 2] = uVar1;
        (in_RSI + lVar4 * 2)[1] = uVar2;
        uVar1 = in_RDX[lVar3];
        in_RDX[lVar3] = in_RDX[lVar4];
        in_RDX[lVar4] = uVar1;
        uVar1 = in_RCX[lVar3];
        in_RCX[lVar3] = in_RCX[lVar4];
        in_RCX[lVar4] = uVar1;
        dtmp_1.imag = dtmp_1.real;
      }
    }
    for (; (undefined8 *)ia_1 != in_R8; ia_1 = ia_1 + -8) {
      ltmp_1 = 1;
      dtmp_1.imag = (DoublePrecision)in_R8;
      while (dtmp_1.real = (DoublePrecision)((long)dtmp_1.imag + ltmp_1 * 8),
            (ulong)dtmp_1.real <= (ulong)ia_1) {
        ltmp_1 = ltmp_1 * 2;
        if ((dtmp_1.real != (DoublePrecision)ia_1) &&
           (*(long *)dtmp_1.real < *(long *)((long)dtmp_1.real + 8))) {
          dtmp_1.real = (DoublePrecision)((long)dtmp_1.real + 8);
          ltmp_1 = ltmp_1 + 1;
        }
        if (*(long *)dtmp_1.real <= *(long *)dtmp_1.imag) break;
        lVar3 = (long)dtmp_1.imag - (long)in_R8 >> 3;
        lVar4 = (long)dtmp_1.real - (long)in_R8 >> 3;
        uVar1 = *(undefined8 *)dtmp_1.imag;
        *(undefined8 *)dtmp_1.imag = *(undefined8 *)dtmp_1.real;
        *(undefined8 *)dtmp_1.real = uVar1;
        uVar1 = in_RSI[lVar3 * 2];
        uVar2 = (in_RSI + lVar3 * 2)[1];
        in_RSI[lVar3 * 2] = in_RSI[lVar4 * 2];
        (in_RSI + lVar3 * 2)[1] = (in_RSI + lVar4 * 2)[1];
        in_RSI[lVar4 * 2] = uVar1;
        (in_RSI + lVar4 * 2)[1] = uVar2;
        uVar1 = in_RDX[lVar3];
        in_RDX[lVar3] = in_RDX[lVar4];
        in_RDX[lVar4] = uVar1;
        uVar1 = in_RCX[lVar3];
        in_RCX[lVar3] = in_RCX[lVar4];
        in_RCX[lVar4] = uVar1;
        dtmp_1.imag = dtmp_1.real;
      }
      lVar3 = ia_1 - (long)in_R8 >> 3;
      uVar1 = *in_R8;
      *in_R8 = *(undefined8 *)ia_1;
      *(undefined8 *)ia_1 = uVar1;
      uVar1 = *in_RSI;
      uVar2 = in_RSI[1];
      *in_RSI = in_RSI[lVar3 * 2];
      in_RSI[1] = (in_RSI + lVar3 * 2)[1];
      in_RSI[lVar3 * 2] = uVar1;
      (in_RSI + lVar3 * 2)[1] = uVar2;
      uVar1 = *in_RDX;
      *in_RDX = in_RDX[lVar3];
      in_RDX[lVar3] = uVar1;
      uVar1 = *in_RCX;
      *in_RCX = in_RCX[lVar3];
      in_RCX[lVar3] = uVar1;
    }
  }
  return;
}

Assistant:

static void ga_sort_scat_dcpl_(pn, v, i, j, base)
     Integer *pn;
     DoubleComplex *v;
     Integer *i;
     Integer *j;
     Integer *base;
{

  if (*pn < 2) return;

#  undef SWAP  
#  define SWAP(a,b) { \
    Integer ltmp; \
    DoubleComplex dtmp; \
    long ia = a - base; \
    long ib = b - base; \
    ltmp=*a; *a=*b; *b=ltmp; \
    dtmp=v[ia]; v[ia]=v[ib]; v[ib]=dtmp; \
    ltmp=i[ia]; i[ia]=i[ib]; i[ib]=ltmp; \
    ltmp=j[ia]; j[ia]=j[ib]; j[ib]=ltmp; \
  }
  INDEX_SORT(base,pn,SWAP);
}